

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmCommon.cpp
# Opt level: O0

VmConstant *
CreateConstantStruct(Allocator *allocator,SynBase *source,char *value,int size,TypeBase *structType)

{
  VmConstant *this;
  VmType type;
  VmConstant *result;
  TypeBase *structType_local;
  int size_local;
  char *value_local;
  SynBase *source_local;
  Allocator *allocator_local;
  
  if (size % 4 == 0) {
    this = anon_unknown.dwarf_1aec77::get<VmConstant>(allocator);
    type = VmType::Struct((long)size,structType);
    VmConstant::VmConstant(this,allocator,type,source);
    this->sValue = value;
    return this;
  }
  __assert_fail("size % 4 == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmCommon.cpp"
                ,0x7c,
                "VmConstant *CreateConstantStruct(Allocator *, SynBase *, char *, int, TypeBase *)")
  ;
}

Assistant:

VmConstant* CreateConstantStruct(Allocator *allocator, SynBase *source, char *value, int size, TypeBase *structType)
{
	assert(size % 4 == 0);

	VmConstant *result = new (get<VmConstant>(allocator)) VmConstant(allocator, VmType::Struct(size, structType), source);

	result->sValue = value;

	return result;
}